

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

int nni_listener_init(nni_listener *l,nni_sock *s,nni_sp_tran *tran)

{
  nni_stat_item *item;
  nni_stat_item *item_00;
  nni_stat_item *item_01;
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  nni_sp_listener_ops *pnVar4;
  nni_listener *pnVar5;
  byte bVar6;
  
  bVar6 = 0;
  l->l_closed = false;
  l->l_data = (void *)0x0;
  l->l_ref = 1;
  l->l_sock = s;
  l->l_tran = tran;
  nni_atomic_flag_reset(&l->l_started);
  pnVar4 = tran->tran_listener;
  pnVar5 = l;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar5->l_ops).l_size = pnVar4->l_size;
    pnVar4 = (nni_sp_listener_ops *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (nni_listener *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (l->l_node).ln_next = (nni_list_node *)0x0;
  (l->l_node).ln_prev = (nni_list_node *)0x0;
  nni_list_init_offset(&l->l_pipes,0xa8);
  nni_aio_init(&l->l_acc_aio,listener_accept_cb,l);
  nni_aio_init(&l->l_tmo_aio,listener_timer_cb,l);
  item = &l->st_root;
  nni_stat_init(item,(nni_stat_info *)listener_stats_init_root_info);
  item_00 = &l->st_id;
  nni_stat_init(item_00,(nni_stat_info *)listener_stats_init_id_info);
  nni_stat_add(item,item_00);
  item_01 = &l->st_sock;
  nni_stat_init(item_01,(nni_stat_info *)listener_stats_init_sock_info);
  nni_stat_add(item,item_01);
  nni_stat_init(&l->st_pipes,(nni_stat_info *)listener_stats_init_pipes_info);
  nni_stat_add(item,&l->st_pipes);
  nni_stat_init(&l->st_accept,(nni_stat_info *)listener_stats_init_accept_info);
  nni_stat_add(item,&l->st_accept);
  nni_stat_init(&l->st_disconnect,(nni_stat_info *)listener_stats_init_disconnect_info);
  nni_stat_add(item,&l->st_disconnect);
  nni_stat_init(&l->st_canceled,(nni_stat_info *)listener_stats_init_canceled_info);
  nni_stat_add(item,&l->st_canceled);
  nni_stat_init(&l->st_other,(nni_stat_info *)listener_stats_init_other_info);
  nni_stat_add(item,&l->st_other);
  nni_stat_init(&l->st_timeout,(nni_stat_info *)listener_stats_init_timeout_info);
  nni_stat_add(item,&l->st_timeout);
  nni_stat_init(&l->st_proto,(nni_stat_info *)listener_stats_init_proto_info);
  nni_stat_add(item,&l->st_proto);
  nni_stat_init(&l->st_auth,(nni_stat_info *)listener_stats_init_auth_info);
  nni_stat_add(item,&l->st_auth);
  nni_stat_init(&l->st_oom,(nni_stat_info *)listener_stats_init_oom_info);
  nni_stat_add(item,&l->st_oom);
  nni_stat_init(&l->st_reject,(nni_stat_info *)listener_stats_init_reject_info);
  nni_stat_add(item,&l->st_reject);
  nni_stat_set_id(item,l->l_id);
  nni_stat_set_id(item_00,l->l_id);
  uVar1 = nni_sock_id(l->l_sock);
  nni_stat_set_id(item_01,uVar1);
  l->l_data = l + 1;
  iVar2 = (*(l->l_ops).l_init)(l + 1,&l->l_url,l);
  if ((iVar2 == 0) && (iVar2 = nni_sock_add_listener(s,l), iVar2 == 0)) {
    nni_mtx_lock(&listeners_lk);
    iVar2 = nni_id_alloc32(&listeners,&l->l_id,l);
    nni_mtx_unlock(&listeners_lk);
    if (iVar2 == 0) {
      nni_stat_set_id(item,l->l_id);
      nni_stat_set_id(item_00,l->l_id);
      uVar1 = nni_sock_id(l->l_sock);
      nni_stat_set_id(item_01,uVar1);
      nni_stat_register(item);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
nni_listener_init(nni_listener *l, nni_sock *s, nni_sp_tran *tran)
{
	int   rv;
	void *lp;

	l->l_closed = false;
	l->l_data   = NULL;
	l->l_ref    = 1;
	l->l_sock   = s;
	l->l_tran   = tran;
	nni_atomic_flag_reset(&l->l_started);

	// Make a copy of the endpoint operations.  This allows us to
	// modify them (to override NULLs for example), and avoids an extra
	// dereference on hot paths.
	l->l_ops = *tran->tran_listener;

	NNI_LIST_NODE_INIT(&l->l_node);
	NNI_LIST_INIT(&l->l_pipes, nni_pipe, p_ep_node);

	nni_aio_init(&l->l_acc_aio, listener_accept_cb, l);
	nni_aio_init(&l->l_tmo_aio, listener_timer_cb, l);

	listener_stats_init(l);

	l->l_data = ((uint8_t *) l) + NNI_ALIGN_UP(sizeof(*l));
	lp        = l->l_data;

	rv = l->l_ops.l_init(lp, &l->l_url, l);

	if (rv == 0) {
		rv = nni_sock_add_listener(s, l);
	}

	if (rv == 0) {
		nni_mtx_lock(&listeners_lk);
		rv = nni_id_alloc32(&listeners, &l->l_id, l);
		nni_mtx_unlock(&listeners_lk);
	}

	if (rv == 0) {
		listener_register_stats(l);
	}

	return (rv);
}